

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

bool __thiscall DAM::operator<(DAM *this,DAM *rhs)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator<(&this->dam,&rhs->dam);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&this->dam,&rhs->dam);
    if (bVar1) {
      bVar1 = std::operator<(&this->tag,&rhs->tag);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator<(const DAM & rhs) const
    {
        if(dam < rhs.dam)
            return true;
        else if(dam == rhs.dam)
            return tag < rhs.tag;
        else
            return false;
    }